

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int refineBySim1_init(saucy *s,coloring *c)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *__ptr;
  ulong uVar4;
  Vec_Int_t *randVec;
  saucy_graph *__ptr_00;
  ulong uVar5;
  int who;
  int iVar6;
  
  if (s->pNtk->vPos->nSize != 1) {
    for (iVar6 = 0; iVar6 < NUM_SIM1_ITERATION; iVar6 = iVar6 + 1) {
      uVar1 = s->pNtk->vPos->nSize;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) {
          return 1;
        }
        piVar3 = c->clen + uVar5;
        uVar5 = uVar5 + 1;
      } while (*piVar3 == 0);
      randVec = assignRandomBitsToCells(s->pNtk,c);
      __ptr_00 = buildSim1Graph(s->pNtk,c,randVec,s->iDep,s->oDep);
      if (__ptr_00 == (saucy_graph *)0x0) {
        __assert_fail("g != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcSaucy.c"
                      ,0x4d0,"int refineBySim1_init(struct saucy *, struct coloring *)");
      }
      piVar3 = __ptr_00->adj;
      s->adj = piVar3;
      __ptr = __ptr_00->edg;
      s->edg = __ptr;
      iVar2 = s->nsplits;
      for (who = 0; who < s->n; who = who + c->clen[who] + 1) {
        add_induce(s,c,who);
      }
      refine(s,c);
      if (iVar2 < s->nsplits) {
        for (iVar6 = 0; iVar6 < s->n; iVar6 = iVar6 + c->clen[iVar6] + 1) {
          add_induce(s,c,iVar6);
        }
        refineByDepGraph(s,c);
        iVar6 = 0;
      }
      Vec_IntFree(randVec);
      free(piVar3);
      free(__ptr);
      free(__ptr_00);
    }
  }
  return 1;
}

Assistant:

static int
refineBySim1_init(struct saucy *s, struct coloring *c) 
{
    struct saucy_graph *g;
    Vec_Int_t * randVec;
    int i, j;
    int allOutputsAreDistinguished;
    int nsplits;

    if (Abc_NtkPoNum(s->pNtk) == 1) return 1;
    
    for (i = 0; i < NUM_SIM1_ITERATION; i++) {

        /* if all outputs are distinguished, quit */
        allOutputsAreDistinguished = 1;
        for (j = 0; j < Abc_NtkPoNum(s->pNtk); j++) {
            if (c->clen[j]) {
                allOutputsAreDistinguished = 0;
                break;
            }
        }
        if (allOutputsAreDistinguished) break;

        randVec = assignRandomBitsToCells(s->pNtk, c);      
        g = buildSim1Graph(s->pNtk, c, randVec, s->iDep, s->oDep);
        assert(g != NULL);

        s->adj = g->adj;
        s->edg = g->edg;

        nsplits = s->nsplits;

        for (j = 0; j < s->n; j += c->clen[j]+1)            
                add_induce(s, c, j);
        refine(s, c);

        if (s->nsplits > nsplits) {         
            i = 0; /* reset i */
            /* do more refinement by dependency graph */
            for (j = 0; j < s->n; j += c->clen[j]+1)                
                    add_induce(s, c, j);
            refineByDepGraph(s, c);
        }
        
        Vec_IntFree(randVec);
        ABC_FREE( g->adj );
        ABC_FREE( g->edg );
        ABC_FREE( g );
    }   

    return 1;
}